

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_DamageTarget
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *inflictor_00;
  AActor *source_00;
  PClassActor *filter_00;
  int amount_00;
  VMValue *pVVar1;
  AActor *dmgtarget;
  bool bVar2;
  bool local_7b;
  FName local_78;
  FName local_74;
  AActor *local_70;
  AActor *inflictor;
  AActor *source;
  int local_58;
  int inflict;
  int src;
  FName species;
  MetaClass *filter;
  FName local_40;
  int flags;
  FName damagetype;
  int amount;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16dd,
                  "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16dd,
                  "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  _damagetype = (AActor *)(param->field_0).field_1.a;
  local_7b = true;
  if (_damagetype != (AActor *)0x0) {
    local_7b = DObject::IsKindOf((DObject *)_damagetype,AActor::RegistrationInfo.MyClass);
  }
  if (local_7b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16dd,
                  "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16de,
                  "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16de,
                  "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  flags = param[1].field_0.i;
  FName::FName(&local_40);
  if (numparam < 3) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16df,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    FName::operator=(&local_40,(pVVar1->field_0).i);
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16df,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    FName::operator=(&local_40,param[2].field_0.i);
  }
  if (numparam < 4) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e0,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    filter._4_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e0,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    filter._4_4_ = param[3].field_0.i;
  }
  if (numparam < 5) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    bVar2 = false;
    if ((pVVar1->field_0).field_3.Type == '\x03') {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      bVar2 = true;
      if ((pVVar1->field_0).field_1.atag != 1) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        bVar2 = (pVVar1->field_0).field_1.a == (void *)0x0;
      }
    }
    if (!bVar2) {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e1,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    _src = (PClassActor *)(pVVar1->field_0).field_1.a;
  }
  else {
    bVar2 = false;
    if ((param[4].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[4].field_0.field_1.atag != 1)) {
      bVar2 = param[4].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e1,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    _src = (PClassActor *)param[4].field_0.field_1.a;
  }
  FName::FName((FName *)&inflict);
  if (numparam < 6) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e2,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    FName::operator=((FName *)&inflict,(pVVar1->field_0).i);
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e2,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    FName::operator=((FName *)&inflict,param[5].field_0.i);
  }
  if (numparam < 7) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e3,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    local_58 = (pVVar1->field_0).i;
  }
  else {
    if (param[6].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e3,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_58 = param[6].field_0.i;
  }
  if (numparam < 8) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e4,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    source._4_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e4,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    source._4_4_ = param[7].field_0.i;
  }
  inflictor = COPY_AAPTR(_damagetype,local_58);
  local_70 = COPY_AAPTR(_damagetype,source._4_4_);
  bVar2 = TObjPtr<AActor>::operator!=(&_damagetype->target,(AActor *)0x0);
  if (bVar2) {
    dmgtarget = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_damagetype->target);
    amount_00 = flags;
    source_00 = inflictor;
    inflictor_00 = local_70;
    FName::FName(&local_74,&local_40);
    filter_00 = _src;
    FName::FName(&local_78,(FName *)&inflict);
    DoDamage(dmgtarget,inflictor_00,source_00,amount_00,&local_74,filter._4_4_,filter_00,&local_78);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DamageTarget)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(amount);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->target != NULL)
		DoDamage(self->target, inflictor, source, amount, damagetype, flags, filter, species);
	return 0;
}